

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O3

int flatcc_verify_vector_field
              (flatcc_table_verifier_descriptor_t *td,flatbuffers_voffset_t id,int required,
              size_t elem_size,uint16_t align,size_t max_count)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  flatbuffers_uoffset_t base;
  uint local_2c;
  
  iVar2 = get_offset_field(td,id,required,&local_2c);
  if (local_2c != 0 && iVar2 == 0) {
    uVar3 = *(int *)((long)td->buf + (ulong)local_2c) + local_2c;
    iVar2 = 0x10;
    if (local_2c < uVar3) {
      if ((uVar3 & 3) == 0 && (ulong)uVar3 + 4 <= (ulong)td->end) {
        uVar1 = *(uint *)((long)td->buf + (ulong)uVar3);
        uVar4 = 3;
        if (uVar1 != 0) {
          uVar4 = align - 1 | 3;
        }
        if (((uVar4 & uVar3 + 4) == 0) && (iVar2 = 0x19, uVar1 <= (uint)max_count)) {
          iVar2 = 0x1a;
          if (uVar1 * (int)elem_size <= td->end - (uVar3 + 4)) {
            iVar2 = 0;
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int flatcc_verify_vector_field(flatcc_table_verifier_descriptor_t *td,
        voffset_t id, int required, size_t elem_size, uint16_t align, size_t max_count)
{
    uoffset_t base;

    check_field(td, id, required, base);
    return verify_vector(td->buf, td->end, base, read_uoffset(td->buf, base),
        (uoffset_t)elem_size, align, (uoffset_t)max_count);
}